

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_semaphore_wrapper.hpp
# Opt level: O1

void __thiscall
oqpi::posix_semaphore_wrapper::posix_semaphore_wrapper
          (posix_semaphore_wrapper *this,string *name,sync_object_creation_options creationOption,
          int32_t initCount)

{
  bool bVar1;
  
  this->handle_ = (sem_t *)0x0;
  if (name->_M_string_length == 0) {
    (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->name_,"");
  }
  else {
    std::operator+(&this->name_,"/",name);
  }
  if ((creationOption == open_existing) || ((this->name_)._M_string_length != 0)) {
    bVar1 = initGlobalSemaphore(this,creationOption,initCount);
  }
  else {
    bVar1 = initLocalSemaphore(this,creationOption,initCount);
  }
  if (bVar1 == false) {
    release(this);
  }
  return;
}

Assistant:

posix_semaphore_wrapper(const std::string &name, sync_object_creation_options creationOption, int32_t initCount)
            : handle_(nullptr)
            , name_(name.empty() ? "" : "/" + name)
        {
            const auto isLocalSyncObject = name_.empty();
            if (isLocalSyncObject && creationOption != sync_object_creation_options::open_existing)
            {
                if (!initLocalSemaphore(creationOption, initCount))
                {
                    release();
                }
            }
            else
            {
                if (!initGlobalSemaphore(creationOption, initCount))
                {
                    release();
                }
            }
        }